

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::RunContext::handleFatalErrorCondition(RunContext *this,StringRef message)

{
  size_t *psVar1;
  Flags *this_00;
  IStreamingReporter *pIVar2;
  undefined1 auStack_3b8 [8];
  AssertionResult result;
  undefined1 local_320 [8];
  Totals deltaTotals;
  SectionStats testCaseSectionStats;
  Counts assertions;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_240 [18];
  undefined1 local_120 [8];
  SectionInfo testCaseSection;
  AssertionResultData tempResult;
  StringRef message_local;
  undefined1 local_58 [16];
  string local_48;
  
  message_local.m_start = (char *)message.m_size;
  tempResult._80_8_ = message.m_start;
  (*((this->m_reporter)._M_t.
     super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
     ._M_t.
     super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
     .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl)->
    _vptr_IStreamingReporter[0x10])();
  testCaseSection.lineInfo.line = (size_t)&tempResult.message._M_string_length;
  tempResult.message._M_dataplus._M_p = (pointer)0x0;
  tempResult.message._M_string_length._0_1_ = 0;
  tempResult.message.field_2._8_8_ = &tempResult.reconstructedExpression._M_string_length;
  tempResult.reconstructedExpression._M_dataplus._M_p = (pointer)0x0;
  tempResult.reconstructedExpression._M_string_length._0_1_ = 0;
  tempResult.reconstructedExpression.field_2._8_8_ = 0;
  tempResult.lazyExpression.m_transientExpression._0_1_ = 0;
  tempResult.lazyExpression.m_isNegated = true;
  tempResult.lazyExpression._9_3_ = 2;
  StringRef::operator_cast_to_string
            ((string *)&assertions.failedButOk,(StringRef *)&tempResult.resultType);
  psVar1 = &testCaseSection.lineInfo.line;
  std::__cxx11::string::operator=((string *)psVar1,(string *)&assertions.failedButOk);
  std::__cxx11::string::~string((string *)&assertions.failedButOk);
  result.m_info.capturedExpression.m_size =
       *(size_type *)&(this->m_lastAssertionInfo).resultDisposition;
  this_00 = &result.m_info.resultDisposition;
  auStack_3b8 = (undefined1  [8])(this->m_lastAssertionInfo).macroName.m_start;
  result.m_info.macroName.m_start = (char *)(this->m_lastAssertionInfo).macroName.m_size;
  result.m_info.macroName.m_size = (size_type)(this->m_lastAssertionInfo).lineInfo.file;
  result.m_info.lineInfo.file = (char *)(this->m_lastAssertionInfo).lineInfo.line;
  result.m_info.lineInfo.line = (size_t)(this->m_lastAssertionInfo).capturedExpression.m_start;
  result.m_info.capturedExpression.m_start =
       (char *)(this->m_lastAssertionInfo).capturedExpression.m_size;
  AssertionResultData::AssertionResultData
            ((AssertionResultData *)this_00,(AssertionResultData *)psVar1);
  assertionEnded(this,(AssertionResult *)auStack_3b8);
  handleUnfinishedSections(this);
  SectionInfo::SectionInfo
            ((SectionInfo *)local_120,&(this->m_activeTestCase->super_TestCaseInfo).lineInfo,
             (string *)this->m_activeTestCase);
  testCaseSectionStats.missingAssertions = false;
  testCaseSectionStats._121_7_ = 0;
  assertions.failed = 0;
  assertions.passed = 1;
  SectionStats::SectionStats
            ((SectionStats *)&deltaTotals.testCases.failedButOk,(SectionInfo *)local_120,
             (Counts *)&testCaseSectionStats.missingAssertions,0.0,false);
  pIVar2 = (this->m_reporter)._M_t.
           super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
           ._M_t.
           super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
           .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl;
  (*pIVar2->_vptr_IStreamingReporter[0xb])(pIVar2,&deltaTotals.testCases.failedButOk);
  local_320._0_4_ = 0;
  deltaTotals.testCases.failed = 0;
  deltaTotals.error = 0;
  deltaTotals._4_4_ = 0;
  deltaTotals.assertions.failed = 0;
  deltaTotals.assertions.failedButOk = 0;
  deltaTotals.testCases.passed = 1;
  deltaTotals.assertions.passed = 1;
  pIVar2 = (this->m_reporter)._M_t.
           super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
           ._M_t.
           super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
           .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl;
  message_local.m_size = (size_type)local_58;
  local_58[0] = 0;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  local_48._M_string_length = 0;
  local_48.field_2._M_local_buf[0] = '\0';
  TestCaseStats::TestCaseStats
            ((TestCaseStats *)&assertions.failedButOk,&this->m_activeTestCase->super_TestCaseInfo,
             (Totals *)local_320,(string *)&message_local.m_size,&local_48,false);
  (*pIVar2->_vptr_IStreamingReporter[0xc])(pIVar2,&assertions.failedButOk);
  TestCaseStats::~TestCaseStats((TestCaseStats *)&assertions.failedButOk);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&message_local.m_size);
  psVar1 = &(this->m_totals).testCases.failed;
  *psVar1 = *psVar1 + 1;
  assertions.failedButOk = (size_t)local_240;
  local_240[0]._M_local_buf[0] = '\0';
  testGroupEnded(this,(string *)&assertions.failedButOk,&this->m_totals,1,1);
  std::__cxx11::string::~string((string *)&assertions.failedButOk);
  pIVar2 = (this->m_reporter)._M_t.
           super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
           ._M_t.
           super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
           .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl;
  TestRunStats::TestRunStats
            ((TestRunStats *)&assertions.failedButOk,&this->m_runInfo,&this->m_totals,false);
  (*pIVar2->_vptr_IStreamingReporter[0xe])(pIVar2,&assertions.failedButOk);
  TestRunStats::~TestRunStats((TestRunStats *)&assertions.failedButOk);
  SectionStats::~SectionStats((SectionStats *)&deltaTotals.testCases.failedButOk);
  SectionInfo::~SectionInfo((SectionInfo *)local_120);
  AssertionResultData::~AssertionResultData((AssertionResultData *)this_00);
  AssertionResultData::~AssertionResultData((AssertionResultData *)&testCaseSection.lineInfo.line);
  return;
}

Assistant:

void RunContext::handleFatalErrorCondition(StringRef message) {
        // First notify reporter that bad things happened
        m_reporter->fatalErrorEncountered(message);

        // Don't rebuild the result -- the stringification itself can cause more fatal errors
        // Instead, fake a result data.
        AssertionResultData tempResult(ResultWas::FatalErrorCondition, { false });
        tempResult.message = static_cast<std::string>(message);
        AssertionResult result(m_lastAssertionInfo, tempResult);

        assertionEnded(result);

        handleUnfinishedSections();

        // Recreate section for test case (as we will lose the one that was in scope)
        auto const& testCaseInfo = m_activeTestCase->getTestCaseInfo();
        SectionInfo testCaseSection(testCaseInfo.lineInfo, testCaseInfo.name);

        Counts assertions;
        assertions.failed = 1;
        SectionStats testCaseSectionStats(testCaseSection, assertions, 0, false);
        m_reporter->sectionEnded(testCaseSectionStats);

        auto const& testInfo = m_activeTestCase->getTestCaseInfo();

        Totals deltaTotals;
        deltaTotals.testCases.failed = 1;
        deltaTotals.assertions.failed = 1;
        m_reporter->testCaseEnded(TestCaseStats(testInfo,
            deltaTotals,
            std::string(),
            std::string(),
            false));
        m_totals.testCases.failed++;
        testGroupEnded(std::string(), m_totals, 1, 1);
        m_reporter->testRunEnded(TestRunStats(m_runInfo, m_totals, false));
    }